

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void Eigen::internal::manage_caching_sizes(Action action,ptrdiff_t *l1,ptrdiff_t *l2,ptrdiff_t *l3)

{
  int iVar1;
  ptrdiff_t *ppVar2;
  ptrdiff_t *ppVar3;
  CacheSizes *pCVar4;
  CacheSizes *pCVar5;
  
  if ((manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') &&
     (iVar1 = __cxa_guard_acquire(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                                   m_cacheSizes), iVar1 != 0)) {
    CacheSizes::CacheSizes(&manage_caching_sizes::m_cacheSizes);
    __cxa_guard_release(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes);
  }
  if (action == GetAction) {
    ppVar2 = &manage_caching_sizes::m_cacheSizes.m_l3;
    ppVar3 = &manage_caching_sizes::m_cacheSizes.m_l2;
    pCVar4 = &manage_caching_sizes::m_cacheSizes;
    pCVar5 = (CacheSizes *)l1;
  }
  else {
    if (action != SetAction) {
      return;
    }
    pCVar5 = &manage_caching_sizes::m_cacheSizes;
    ppVar2 = l3;
    ppVar3 = l2;
    pCVar4 = (CacheSizes *)l1;
    l2 = &manage_caching_sizes::m_cacheSizes.m_l2;
    l3 = &manage_caching_sizes::m_cacheSizes.m_l3;
  }
  pCVar5->m_l1 = pCVar4->m_l1;
  *l2 = *ppVar3;
  *l3 = *ppVar2;
  return;
}

Assistant:

inline void manage_caching_sizes(Action action, std::ptrdiff_t* l1, std::ptrdiff_t* l2, std::ptrdiff_t* l3)
{
  static CacheSizes m_cacheSizes;

  if(action==SetAction)
  {
    // set the cpu cache size and cache all block sizes from a global cache size in byte
    eigen_internal_assert(l1!=0 && l2!=0);
    m_cacheSizes.m_l1 = *l1;
    m_cacheSizes.m_l2 = *l2;
    m_cacheSizes.m_l3 = *l3;
  }
  else if(action==GetAction)
  {
    eigen_internal_assert(l1!=0 && l2!=0);
    *l1 = m_cacheSizes.m_l1;
    *l2 = m_cacheSizes.m_l2;
    *l3 = m_cacheSizes.m_l3;
  }
  else
  {
    eigen_internal_assert(false);
  }
}